

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O0

string * __thiscall
diligent_spirv_cross::CompilerGLSL::emit_for_loop_initializers_abi_cxx11_
          (string *__return_storage_ptr__,CompilerGLSL *this,SPIRBlock *block)

{
  int iVar1;
  bool bVar2;
  uint32_t uVar3;
  Types TVar4;
  SPIRVariable *pSVar5;
  Variant *pVVar6;
  size_t sVar7;
  TypedID *this_00;
  ulong uVar8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_R8;
  string local_1c8;
  diligent_spirv_cross local_1a8 [32];
  string local_188;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_168;
  diligent_spirv_cross local_148 [32];
  string local_128;
  SPIRType *local_108;
  SPIRType *type;
  SPIRVariable *var;
  uint32_t local_d4;
  TypedID *pTStack_d0;
  uint32_t static_expr;
  TypedID<(diligent_spirv_cross::Types)2> *loop_var_1;
  TypedID<(diligent_spirv_cross::Types)2> *__end3_1;
  TypedID<(diligent_spirv_cross::Types)2> *__begin3_1;
  SmallVector<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)2>,_8UL> *__range3_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  TypedID<(diligent_spirv_cross::Types)2> *local_88;
  TypedID<(diligent_spirv_cross::Types)2> *loop_var;
  TypedID<(diligent_spirv_cross::Types)2> *__end3;
  TypedID<(diligent_spirv_cross::Types)2> *__begin3;
  SmallVector<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)2>,_8UL> *__range3;
  TypedID<(diligent_spirv_cross::Types)2> *pTStack_60;
  uint32_t expr;
  TypedID<(diligent_spirv_cross::Types)2> *variable;
  TypedID<(diligent_spirv_cross::Types)2> *__end1;
  TypedID<(diligent_spirv_cross::Types)2> *__begin1;
  SmallVector<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)2>,_8UL> *__range1;
  byte local_35;
  uint32_t missing_initializers;
  bool same_types;
  allocator local_21;
  SPIRBlock *local_20;
  SPIRBlock *block_local;
  CompilerGLSL *this_local;
  string *expr_1;
  
  local_20 = block;
  block_local = (SPIRBlock *)this;
  this_local = (CompilerGLSL *)__return_storage_ptr__;
  bVar2 = VectorView<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)2>_>::empty
                    (&(block->loop_variables).
                      super_VectorView<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)2>_>
                    );
  if (bVar2) {
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)__return_storage_ptr__,"",&local_21);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_21);
  }
  else {
    local_35 = for_loop_initializers_are_same_type(this,local_20);
    __range1._4_4_ = 0;
    __begin1 = (TypedID<(diligent_spirv_cross::Types)2> *)&local_20->loop_variables;
    __end1 = VectorView<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)2>_>::begin
                       ((VectorView<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)2>_>
                         *)__begin1);
    variable = VectorView<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)2>_>::end
                         ((VectorView<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)2>_>
                           *)__begin1);
    for (; __end1 != variable; __end1 = __end1 + 1) {
      pTStack_60 = __end1;
      uVar3 = TypedID::operator_cast_to_unsigned_int((TypedID *)__end1);
      pSVar5 = Compiler::get<diligent_spirv_cross::SPIRVariable>(&this->super_Compiler,uVar3);
      __range3._4_4_ = TypedID::operator_cast_to_unsigned_int((TypedID *)&pSVar5->static_expression)
      ;
      if (__range3._4_4_ == 0) {
LAB_00d35795:
        __range1._4_4_ = __range1._4_4_ + 1;
      }
      else {
        pVVar6 = VectorView<diligent_spirv_cross::Variant>::operator[]
                           (&(this->super_Compiler).ir.ids.
                             super_VectorView<diligent_spirv_cross::Variant>,(ulong)__range3._4_4_);
        TVar4 = Variant::get_type(pVVar6);
        if (TVar4 == TypeUndef) goto LAB_00d35795;
      }
    }
    sVar7 = VectorView<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)2>_>::size
                      (&(local_20->loop_variables).
                        super_VectorView<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)2>_>
                      );
    iVar1 = __range1._4_4_;
    if ((sVar7 == 1) && (__range1._4_4_ == 0)) {
      this_00 = (TypedID *)
                VectorView<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)2>_>::front
                          (&(local_20->loop_variables).
                            super_VectorView<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)2>_>
                          );
      uVar3 = TypedID::operator_cast_to_unsigned_int(this_00);
      pSVar5 = Compiler::get<diligent_spirv_cross::SPIRVariable>(&this->super_Compiler,uVar3);
      (*(this->super_Compiler)._vptr_Compiler[0x28])(__return_storage_ptr__,this,pSVar5);
    }
    else if (((local_35 & 1) == 0) ||
            (sVar7 = VectorView<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)2>_>::
                     size(&(local_20->loop_variables).
                           super_VectorView<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)2>_>
                         ), iVar1 == (int)sVar7)) {
      __begin3 = (TypedID<(diligent_spirv_cross::Types)2> *)&local_20->loop_variables;
      __end3 = VectorView<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)2>_>::begin
                         ((VectorView<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)2>_>
                           *)__begin3);
      loop_var = VectorView<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)2>_>::end
                           ((VectorView<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)2>_>
                             *)__begin3);
      for (; __end3 != loop_var; __end3 = __end3 + 1) {
        local_88 = __end3;
        uVar3 = TypedID::operator_cast_to_unsigned_int((TypedID *)__end3);
        pSVar5 = Compiler::get<diligent_spirv_cross::SPIRVariable>(&this->super_Compiler,uVar3);
        (*(this->super_Compiler)._vptr_Compiler[0x28])(&local_a8,this,pSVar5);
        statement<std::__cxx11::string,char_const(&)[2]>(this,&local_a8,(char (*) [2])0xf651e6);
        ::std::__cxx11::string::~string((string *)&local_a8);
      }
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string
                ((string *)__return_storage_ptr__,"",(allocator *)((long)&__range3_1 + 7));
      ::std::allocator<char>::~allocator((allocator<char> *)((long)&__range3_1 + 7));
    }
    else {
      __range3_1._6_1_ = 0;
      ::std::__cxx11::string::string((string *)__return_storage_ptr__);
      __begin3_1 = (TypedID<(diligent_spirv_cross::Types)2> *)&local_20->loop_variables;
      __end3_1 = VectorView<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)2>_>::begin
                           ((VectorView<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)2>_>
                             *)__begin3_1);
      loop_var_1 = VectorView<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)2>_>::end
                             ((VectorView<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)2>_>
                               *)__begin3_1);
      for (; __end3_1 != loop_var_1; __end3_1 = __end3_1 + 1) {
        pTStack_d0 = (TypedID *)__end3_1;
        uVar3 = TypedID::operator_cast_to_unsigned_int((TypedID *)__end3_1);
        pSVar5 = Compiler::get<diligent_spirv_cross::SPIRVariable>(&this->super_Compiler,uVar3);
        local_d4 = TypedID::operator_cast_to_unsigned_int((TypedID *)&pSVar5->static_expression);
        if (local_d4 == 0) {
LAB_00d35a6a:
          uVar3 = TypedID::operator_cast_to_unsigned_int(pTStack_d0);
          pSVar5 = Compiler::get<diligent_spirv_cross::SPIRVariable>(&this->super_Compiler,uVar3);
          (*(this->super_Compiler)._vptr_Compiler[0x28])(&var,this,pSVar5);
          statement<std::__cxx11::string,char_const(&)[2]>
                    (this,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&var,
                     (char (*) [2])0xf651e6);
          ::std::__cxx11::string::~string((string *)&var);
        }
        else {
          pVVar6 = VectorView<diligent_spirv_cross::Variant>::operator[]
                             (&(this->super_Compiler).ir.ids.
                               super_VectorView<diligent_spirv_cross::Variant>,(ulong)local_d4);
          TVar4 = Variant::get_type(pVVar6);
          if (TVar4 == TypeUndef) goto LAB_00d35a6a;
          uVar3 = TypedID::operator_cast_to_unsigned_int(pTStack_d0);
          type = (SPIRType *)
                 Compiler::get<diligent_spirv_cross::SPIRVariable>(&this->super_Compiler,uVar3);
          local_108 = Compiler::get_variable_data_type(&this->super_Compiler,(SPIRVariable *)type);
          uVar8 = ::std::__cxx11::string::empty();
          if ((uVar8 & 1) == 0) {
            ::std::__cxx11::string::operator+=((string *)__return_storage_ptr__,", ");
            if ((local_108->pointer & 1U) != 0) {
              ::std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"* ");
            }
          }
          else {
            uVar3 = TypedID::operator_cast_to_unsigned_int((TypedID *)&(type->super_IVariant).self);
            (*(this->super_Compiler)._vptr_Compiler[0x33])(local_148,this,(ulong)uVar3);
            (*(this->super_Compiler)._vptr_Compiler[0x13])(&local_168,this,local_108,0);
            join<std::__cxx11::string,std::__cxx11::string,char_const(&)[2]>
                      (&local_128,local_148,&local_168,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0xf43b35
                       ,(char (*) [2])in_R8);
            ::std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_128)
            ;
            ::std::__cxx11::string::~string((string *)&local_128);
            ::std::__cxx11::string::~string((string *)&local_168);
            ::std::__cxx11::string::~string((string *)local_148);
          }
          uVar3 = TypedID::operator_cast_to_unsigned_int(pTStack_d0);
          (*(this->super_Compiler)._vptr_Compiler[6])(local_1a8,this,(ulong)uVar3,1);
          uVar3 = TypedID::operator_cast_to_unsigned_int
                            ((TypedID *)
                             ((long)&(type->array_size_literal).super_VectorView<bool>.ptr + 4));
          to_pointer_expression_abi_cxx11_(&local_1c8,this,uVar3,true);
          join<std::__cxx11::string,char_const(&)[4],std::__cxx11::string>
                    (&local_188,local_1a8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0xf415bc,
                     (char (*) [4])&local_1c8,in_R8);
          ::std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_188);
          ::std::__cxx11::string::~string((string *)&local_188);
          ::std::__cxx11::string::~string((string *)&local_1c8);
          ::std::__cxx11::string::~string((string *)local_1a8);
        }
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

string CompilerGLSL::emit_for_loop_initializers(const SPIRBlock &block)
{
	if (block.loop_variables.empty())
		return "";

	bool same_types = for_loop_initializers_are_same_type(block);
	// We can only declare for loop initializers if all variables are of same type.
	// If we cannot do this, declare individual variables before the loop header.

	// We might have a loop variable candidate which was not assigned to for some reason.
	uint32_t missing_initializers = 0;
	for (auto &variable : block.loop_variables)
	{
		uint32_t expr = get<SPIRVariable>(variable).static_expression;

		// Sometimes loop variables are initialized with OpUndef, but we can just declare
		// a plain variable without initializer in this case.
		if (expr == 0 || ir.ids[expr].get_type() == TypeUndef)
			missing_initializers++;
	}

	if (block.loop_variables.size() == 1 && missing_initializers == 0)
	{
		return variable_decl(get<SPIRVariable>(block.loop_variables.front()));
	}
	else if (!same_types || missing_initializers == uint32_t(block.loop_variables.size()))
	{
		for (auto &loop_var : block.loop_variables)
			statement(variable_decl(get<SPIRVariable>(loop_var)), ";");
		return "";
	}
	else
	{
		// We have a mix of loop variables, either ones with a clear initializer, or ones without.
		// Separate the two streams.
		string expr;

		for (auto &loop_var : block.loop_variables)
		{
			uint32_t static_expr = get<SPIRVariable>(loop_var).static_expression;
			if (static_expr == 0 || ir.ids[static_expr].get_type() == TypeUndef)
			{
				statement(variable_decl(get<SPIRVariable>(loop_var)), ";");
			}
			else
			{
				auto &var = get<SPIRVariable>(loop_var);
				auto &type = get_variable_data_type(var);
				if (expr.empty())
				{
					// For loop initializers are of the form <type id = value, id = value, id = value, etc ...
					expr = join(to_qualifiers_glsl(var.self), type_to_glsl(type), " ");
				}
				else
				{
					expr += ", ";
					// In MSL, being based on C++, the asterisk marking a pointer
					// binds to the identifier, not the type.
					if (type.pointer)
						expr += "* ";
				}

				expr += join(to_name(loop_var), " = ", to_pointer_expression(var.static_expression));
			}
		}
		return expr;
	}
}